

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::RealMath1Function<&tanh>::~RealMath1Function(RealMath1Function<&tanh> *this)

{
  SimpleSystemSubroutine::~SimpleSystemSubroutine(&this->super_SimpleSystemSubroutine);
  return;
}

Assistant:

RealMath1Function(const Builtins& builtins, KnownSystemName knownNameId) :
        SimpleSystemSubroutine(knownNameId, SubroutineKind::Function, 1, {&builtins.realType},
                               builtins.realType, false) {}